

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

uint8_t * get_next_scanline(tgestate_t *state,uint8_t *slp)

{
  uint uVar1;
  uint8_t *puVar2;
  short sVar3;
  uint uVar5;
  ulong uVar4;
  
  puVar2 = (state->speccy->screen).pixels;
  uVar5 = (int)slp - (int)puVar2;
  uVar1 = uVar5 + 0x100;
  if ((uVar1 & 0x700) == 0) {
    sVar3 = (short)uVar5 + 0x20;
    if ((~uVar5 & 0xe0) != 0) {
      sVar3 = (short)uVar1 + -0x7e0;
    }
    uVar4 = (ulong)sVar3;
  }
  else {
    uVar4 = (ulong)(uVar1 & 0xffff);
  }
  return puVar2 + uVar4;
}

Assistant:

uint8_t *get_next_scanline(tgestate_t *state, uint8_t *slp)
{
  uint8_t *const screen = &state->speccy->screen.pixels[0]; /* added */
  uint16_t       offset; /* was HL */
  uint16_t       delta;  /* was DE */

  assert(state != NULL);
  assert(slp   != NULL);

  offset = slp - screen; // note: narrowing

  assert(offset < 0x8000);

  offset += 0x0100;
  if (offset & 0x0700)
    return screen + offset; /* line count didn't rollover */

  if ((offset & 0xFF) >= 0xE0)
    delta = 0xFF20; /* -224 */
  else
    delta = 0xF820; /* -2016 */

  offset += delta;

  return screen + (int16_t) offset;
}